

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanCommandBuffer.hpp
# Opt level: O3

void __thiscall
VulkanUtilities::VulkanCommandBuffer::WriteAccelerationStructuresProperties
          (VulkanCommandBuffer *this,VkAccelerationStructureKHR accelerationStructure,
          VkQueryType queryType,VkQueryPool queryPool,uint32_t firstQuery)

{
  string msg;
  VkAccelerationStructureKHR local_50;
  string local_48;
  
  local_50 = accelerationStructure;
  if (this->m_VkCmdBuffer == (VkCommandBuffer)0x0) {
    Diligent::FormatString<char[26],char[32]>
              (&local_48,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_VkCmdBuffer != VK_NULL_HANDLE",(char (*) [32])queryPool);
    Diligent::DebugAssertionFailed
              (local_48._M_dataplus._M_p,"WriteAccelerationStructuresProperties",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/VulkanUtilities/VulkanCommandBuffer.hpp"
               ,700);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  if ((this->m_State).RenderPass == (VkRenderPass)0x0) {
    if ((this->m_State).DynamicRenderingHash != 0) {
      EndRendering(this);
    }
  }
  else {
    EndRenderPass(this);
  }
  FlushBarriers(this);
  (*vkCmdWriteAccelerationStructuresPropertiesKHR)
            (this->m_VkCmdBuffer,1,&local_50,queryType,queryPool,firstQuery);
  return;
}

Assistant:

__forceinline void WriteAccelerationStructuresProperties(VkAccelerationStructureKHR accelerationStructure, VkQueryType queryType, VkQueryPool queryPool, uint32_t firstQuery)
    {
#if DILIGENT_USE_VOLK
        VERIFY_EXPR(m_VkCmdBuffer != VK_NULL_HANDLE);
        // Write AS properties operations must be performed outside of render pass.
        EndRenderScope();
        FlushBarriers();
        vkCmdWriteAccelerationStructuresPropertiesKHR(m_VkCmdBuffer, 1, &accelerationStructure, queryType, queryPool, firstQuery);
#else
        UNSUPPORTED("Ray tracing is not supported when vulkan library is linked statically");
#endif
    }